

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_frontend_test.cpp
# Opt level: O2

void __thiscall test_app::test_gzip(test_app *this)

{
  bool bVar1;
  char cVar2;
  uint uVar3;
  ostream *poVar4;
  string *psVar5;
  runtime_error *prVar6;
  string sStack_1c8;
  allocator local_1a1;
  ostringstream oss;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  poVar4 = std::operator<<((ostream *)&std::cout,"- Page Gzip");
  std::endl<char,std::char_traits<char>>(poVar4);
  set_context(this,true);
  cppcms::application::cache();
  cppcms::cache_interface::clear();
  cppcms::application::request();
  cppcms::http::request::getenv_abi_cxx11_((char *)&oss);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss,
                          "gzip, deflate");
  std::__cxx11::string::~string((string *)&oss);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar4 = std::operator<<((ostream *)&oss,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x78);
    std::operator<<(poVar4," request().getenv(\"HTTP_ACCEPT_ENCODING\") == \"gzip, deflate\"");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&sStack_1c8);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cppcms::application::request();
  std::__cxx11::string::string((string *)&sStack_1c8,"HTTP_ACCEPT_ENCODING",&local_1a1);
  cppcms::http::request::getenv((string *)&oss);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss,
                          "gzip, deflate");
  std::__cxx11::string::~string((string *)&oss);
  std::__cxx11::string::~string((string *)&sStack_1c8);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar4 = std::operator<<((ostream *)&oss,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x79);
    std::operator<<(poVar4,
                    " request().getenv(std::string(\"HTTP_ACCEPT_ENCODING\")) == \"gzip, deflate\"")
    ;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&sStack_1c8);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  psVar5 = (string *)cppcms::application::cache();
  std::__cxx11::string::string((string *)&oss,"test",(allocator *)&sStack_1c8);
  cppcms::cache_interface::fetch_page(psVar5);
  std::__cxx11::string::~string((string *)&oss);
  cppcms::application::response();
  poVar4 = (ostream *)cppcms::http::response::out();
  std::operator<<(poVar4,"gzip");
  psVar5 = (string *)cppcms::application::cache();
  std::__cxx11::string::string((string *)&oss,"test",(allocator *)&sStack_1c8);
  cppcms::cache_interface::store_page(psVar5,(int)&oss);
  std::__cxx11::string::~string((string *)&oss);
  str_abi_cxx11_(&sStack_1c8,this);
  std::__cxx11::string::substr((ulong)&oss,(ulong)&sStack_1c8);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss,
                          anon_var_dwarf_9691);
  std::__cxx11::string::~string((string *)&oss);
  std::__cxx11::string::~string((string *)&sStack_1c8);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar4 = std::operator<<((ostream *)&oss,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x7d);
    std::operator<<(poVar4," str().substr(0,2)==\"\\x1f\\x8b\"");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&sStack_1c8);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (this->gzip_ == false) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar4 = std::operator<<((ostream *)&oss,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x7e);
    std::operator<<(poVar4," gzip_");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&sStack_1c8);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  set_context(this,false);
  cppcms::application::request();
  cppcms::http::request::getenv_abi_cxx11_((char *)&oss);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss,
                          "");
  std::__cxx11::string::~string((string *)&oss);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar4 = std::operator<<((ostream *)&oss,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x82);
    std::operator<<(poVar4," request().getenv(\"HTTP_ACCEPT_ENCODING\") == \"\"");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&sStack_1c8);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar3 = cache_size(this);
  if (uVar3 != 1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar4 = std::operator<<((ostream *)&oss,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x83);
    std::operator<<(poVar4," cache_size() == 1");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&sStack_1c8);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  psVar5 = (string *)cppcms::application::cache();
  std::__cxx11::string::string((string *)&oss,"test",(allocator *)&sStack_1c8);
  cVar2 = cppcms::cache_interface::fetch_page(psVar5);
  std::__cxx11::string::~string((string *)&oss);
  if (cVar2 != '\0') {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar4 = std::operator<<((ostream *)&oss,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x85);
    std::operator<<(poVar4," cache().fetch_page(\"test\") ==false");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&sStack_1c8);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cppcms::application::response();
  poVar4 = (ostream *)cppcms::http::response::out();
  std::operator<<(poVar4,"gzip");
  psVar5 = (string *)cppcms::application::cache();
  std::__cxx11::string::string((string *)&oss,"test",(allocator *)&sStack_1c8);
  cppcms::cache_interface::store_page(psVar5,(int)&oss);
  std::__cxx11::string::~string((string *)&oss);
  str_abi_cxx11_((string *)&oss,this);
  bVar1 = std::operator==((string *)&oss,"gzip");
  std::__cxx11::string::~string((string *)&oss);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar4 = std::operator<<((ostream *)&oss,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x88);
    std::operator<<(poVar4," str() == \"gzip\"");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&sStack_1c8);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (this->gzip_ == true) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar4 = std::operator<<((ostream *)&oss,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x89);
    std::operator<<(poVar4," !gzip_");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&sStack_1c8);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  set_context(this,false);
  psVar5 = (string *)cppcms::application::cache();
  std::__cxx11::string::string((string *)&oss,"test",(allocator *)&sStack_1c8);
  cVar2 = cppcms::cache_interface::fetch_page(psVar5);
  std::__cxx11::string::~string((string *)&oss);
  if (cVar2 == '\0') {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar4 = std::operator<<((ostream *)&oss,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x8c);
    std::operator<<(poVar4," cache().fetch_page(\"test\")");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&sStack_1c8);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  str_abi_cxx11_((string *)&oss,this);
  bVar1 = std::operator==((string *)&oss,"gzip");
  std::__cxx11::string::~string((string *)&oss);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar4 = std::operator<<((ostream *)&oss,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x8d);
    std::operator<<(poVar4," str()==\"gzip\"");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&sStack_1c8);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (this->gzip_ == true) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar4 = std::operator<<((ostream *)&oss,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x8e);
    std::operator<<(poVar4," !gzip_");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&sStack_1c8);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  set_context(this,true);
  psVar5 = (string *)cppcms::application::cache();
  std::__cxx11::string::string((string *)&oss,"test",(allocator *)&sStack_1c8);
  cVar2 = cppcms::cache_interface::fetch_page(psVar5);
  std::__cxx11::string::~string((string *)&oss);
  if (cVar2 == '\0') {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar4 = std::operator<<((ostream *)&oss,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x91);
    std::operator<<(poVar4," cache().fetch_page(\"test\")");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&sStack_1c8);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  str_abi_cxx11_(&sStack_1c8,this);
  std::__cxx11::string::substr((ulong)&oss,(ulong)&sStack_1c8);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss,
                          anon_var_dwarf_9691);
  std::__cxx11::string::~string((string *)&oss);
  std::__cxx11::string::~string((string *)&sStack_1c8);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar4 = std::operator<<((ostream *)&oss,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x92);
    std::operator<<(poVar4," str().substr(0,2)==\"\\x1f\\x8b\"");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&sStack_1c8);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (this->gzip_ == false) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar4 = std::operator<<((ostream *)&oss,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x93);
    std::operator<<(poVar4," gzip_");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&sStack_1c8);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  set_context(this,false);
  uVar3 = cache_size(this);
  if (uVar3 == 2) {
    cppcms::application::cache();
    cppcms::cache_interface::clear();
    uVar3 = cache_size(this);
    if (uVar3 == 0) {
      cppcms::application::release_context();
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
      return;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar4 = std::operator<<((ostream *)&oss,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x98);
    std::operator<<(poVar4," cache_size()==0");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&sStack_1c8);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  poVar4 = std::operator<<((ostream *)&oss,"Error ");
  poVar4 = std::operator<<(poVar4,
                           "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                          );
  poVar4 = std::operator<<(poVar4,":");
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x96);
  std::operator<<(poVar4," cache_size()==2");
  prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar6,(string *)&sStack_1c8);
  __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void test_gzip()
	{
		std::cout << "- Page Gzip" << std::endl;
		set_context(true);
		cache().clear();
		TEST(request().getenv("HTTP_ACCEPT_ENCODING") == "gzip, deflate");
		TEST(request().getenv(std::string("HTTP_ACCEPT_ENCODING")) == "gzip, deflate");
		cache().fetch_page("test");
		response().out() << "gzip";
		cache().store_page("test");
		TEST(str().substr(0,2)=="\x1f\x8b");
		TEST(gzip_);
		
		set_context(false);
	
		TEST(request().getenv("HTTP_ACCEPT_ENCODING") == "");
		TEST(cache_size() == 1);

		TEST(cache().fetch_page("test") ==false);
		response().out() << "gzip";
		cache().store_page("test");
		TEST(str() == "gzip");
		TEST(!gzip_);

		set_context(false);
		TEST(cache().fetch_page("test"));
		TEST(str()=="gzip");
		TEST(!gzip_);

		set_context(true);
		TEST(cache().fetch_page("test"));
		TEST(str().substr(0,2)=="\x1f\x8b");
		TEST(gzip_);

		set_context(false);
		TEST(cache_size()==2);
		cache().clear();
		TEST(cache_size()==0);
		release_context();
	}